

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool VerifyScript(CScript *scriptSig,CScript *scriptPubKey,CScriptWitness *witness,uint flags,
                 BaseSignatureChecker *checker,ScriptError *serror)

{
  long lVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  span<const_unsigned_char,_18446744073709551615UL> b;
  iterator __last;
  iterator __first;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  __extent_storage<18446744073709551615UL> _Var10;
  iterator this;
  CScript *this_00;
  size_type sVar11;
  uint in_ECX;
  pointer in_RDI;
  long in_FS_OFFSET;
  valtype *pubKeySerialized;
  bool hadWitness;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stackCopy;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  CScript pubKey2;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffe60;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe71;
  undefined1 in_stack_fffffffffffffe72;
  undefined1 in_stack_fffffffffffffe73;
  undefined1 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe78;
  BaseSignatureChecker *in_stack_fffffffffffffe80;
  allocator_type *__a;
  undefined8 in_stack_fffffffffffffe88;
  uint flags_00;
  CScript *in_stack_fffffffffffffe90;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined1 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffea9;
  undefined1 in_stack_fffffffffffffeaa;
  undefined1 in_stack_fffffffffffffeab;
  undefined1 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  size_type in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffef8;
  byte local_c2;
  allocator_type local_c1 [72];
  undefined1 in_stack_ffffffffffffff87;
  ScriptError *in_stack_ffffffffffffff88;
  BaseSignatureChecker *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff9c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  CScriptWitness *in_stack_ffffffffffffffb0;
  
  flags_00 = (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((VerifyScript(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int,BaseSignatureChecker_const&,ScriptError_t*)
       ::emptyWitness == '\0') &&
     (iVar9 = __cxa_guard_acquire(&VerifyScript(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int,BaseSignatureChecker_const&,ScriptError_t*)
                                   ::emptyWitness), iVar9 != 0)) {
    CScriptWitness::CScriptWitness
              ((CScriptWitness *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    __cxa_atexit(CScriptWitness::~CScriptWitness,&VerifyScript::emptyWitness,&__dso_handle);
    __cxa_guard_release(&VerifyScript(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int,BaseSignatureChecker_const&,ScriptError_t*)
                         ::emptyWitness);
  }
  bVar8 = false;
  anon_unknown.dwarf_4a160d::set_error
            ((ScriptError *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             SCRIPT_ERR_OK);
  if (((in_ECX & 0x20) != 0) &&
     (bVar2 = CScript::IsPushOnly((CScript *)in_stack_fffffffffffffe68), !bVar2)) {
    local_c2 = anon_unknown.dwarf_4a160d::set_error
                         ((ScriptError *)
                          CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                          SCRIPT_ERR_OK);
    goto LAB_003ed7fe;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  bVar2 = EvalScript(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,flags_00,
                     in_stack_fffffffffffffe80,
                     (SigVersion)((ulong)in_stack_fffffffffffffe78._M_current >> 0x20),
                     (ScriptError *)
                     CONCAT17(in_stack_fffffffffffffe77,
                              CONCAT16(in_stack_fffffffffffffe76,
                                       CONCAT15(in_stack_fffffffffffffe75,
                                                CONCAT14(in_stack_fffffffffffffe74,
                                                         CONCAT13(in_stack_fffffffffffffe73,
                                                                  CONCAT12(in_stack_fffffffffffffe72
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe71,
                                                  in_stack_fffffffffffffe70))))))));
  if (bVar2) {
    if ((in_ECX & 1) != 0) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(in_stack_fffffffffffffef8,
                  (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    uVar3 = EvalScript(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,flags_00,
                       in_stack_fffffffffffffe80,
                       (SigVersion)((ulong)in_stack_fffffffffffffe78._M_current >> 0x20),
                       (ScriptError *)
                       CONCAT17(in_stack_fffffffffffffe77,
                                CONCAT16(in_stack_fffffffffffffe76,
                                         CONCAT15(in_stack_fffffffffffffe75,
                                                  CONCAT14(in_stack_fffffffffffffe74,
                                                           CONCAT13(in_stack_fffffffffffffe73,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  CONCAT11(in_stack_fffffffffffffe71,
                                                           in_stack_fffffffffffffe70))))))));
    if ((bool)uVar3) {
      bVar2 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_fffffffffffffe68);
      if (bVar2) {
        local_c2 = anon_unknown.dwarf_4a160d::set_error
                             ((ScriptError *)
                              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                              SCRIPT_ERR_OK);
      }
      else {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar2 = CastToBool((valtype *)
                           CONCAT17(in_stack_fffffffffffffe77,
                                    CONCAT16(in_stack_fffffffffffffe76,
                                             CONCAT15(in_stack_fffffffffffffe75,
                                                      CONCAT14(in_stack_fffffffffffffe74,
                                                               CONCAT13(in_stack_fffffffffffffe73,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  CONCAT11(in_stack_fffffffffffffe71,
                                                           in_stack_fffffffffffffe70))))))));
        if (bVar2) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          if (((in_ECX & 0x800) == 0) ||
             (in_stack_fffffffffffffeb4 =
                   CScript::IsWitnessProgram
                             ((CScript *)
                              CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffeb6,
                                                      CONCAT15(in_stack_fffffffffffffeb5,
                                                               CONCAT14(in_stack_fffffffffffffeb4,
                                                                        in_stack_fffffffffffffeb0)))
                                      ),
                              (int *)CONCAT17(in_stack_fffffffffffffeaf,
                                              CONCAT16(in_stack_fffffffffffffeae,
                                                       CONCAT15(in_stack_fffffffffffffead,
                                                                CONCAT14(in_stack_fffffffffffffeac,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffeab,
                                                  CONCAT12(in_stack_fffffffffffffeaa,
                                                           CONCAT11(in_stack_fffffffffffffea9,
                                                                    in_stack_fffffffffffffea8)))))))
                              ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)),
             !(bool)in_stack_fffffffffffffeb4)) {
LAB_003ed10a:
            if (((in_ECX & 1) == 0) ||
               (uVar4 = CScript::IsPayToScriptHash((CScript *)in_stack_fffffffffffffe68),
               !(bool)uVar4)) {
LAB_003ed61c:
              if ((in_ECX & 0x100) != 0) {
                if ((in_ECX & 1) == 0) {
                  __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                                ,0x80b,
                                "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                               );
                }
                if ((in_ECX & 0x800) == 0) {
                  __assert_fail("(flags & SCRIPT_VERIFY_WITNESS) != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                                ,0x80c,
                                "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                               );
                }
                sVar11 = std::
                         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
                if (sVar11 != 1) {
                  local_c2 = anon_unknown.dwarf_4a160d::set_error
                                       ((ScriptError *)
                                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58
                                                ),SCRIPT_ERR_OK);
                  goto LAB_003ed7a8;
                }
              }
              if ((in_ECX & 0x800) != 0) {
                if ((in_ECX & 1) == 0) {
                  __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                                ,0x816,
                                "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                               );
                }
                if ((!bVar8) &&
                   (bVar8 = CScriptWitness::IsNull
                                      ((CScriptWitness *)
                                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                                      ), !bVar8)) {
                  local_c2 = anon_unknown.dwarf_4a160d::set_error
                                       ((ScriptError *)
                                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58
                                                ),SCRIPT_ERR_OK);
                  goto LAB_003ed7a8;
                }
              }
              local_c2 = anon_unknown.dwarf_4a160d::set_success
                                   ((ScriptError *)
                                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            }
            else {
              uVar5 = CScript::IsPushOnly((CScript *)in_stack_fffffffffffffe68);
              if ((bool)uVar5) {
                std::
                swap<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)0x3ed1a4);
                bVar2 = std::
                        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)in_stack_fffffffffffffe68);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  __assert_fail("!stack.empty()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                                ,0x7e4,
                                "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                               );
                }
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffe60);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffe60);
                last._M_current._1_1_ = in_stack_fffffffffffffe71;
                last._M_current._0_1_ = in_stack_fffffffffffffe70;
                last._M_current._2_1_ = in_stack_fffffffffffffe72;
                last._M_current._3_1_ = in_stack_fffffffffffffe73;
                last._M_current._4_1_ = in_stack_fffffffffffffe74;
                last._M_current._5_1_ = in_stack_fffffffffffffe75;
                last._M_current._6_1_ = in_stack_fffffffffffffe76;
                last._M_current._7_1_ = in_stack_fffffffffffffe77;
                CScript::
                CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ((CScript *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe78,last);
                popstack((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)in_stack_fffffffffffffe78._M_current);
                uVar6 = EvalScript(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,flags_00,
                                   in_stack_fffffffffffffe80,
                                   (SigVersion)((ulong)in_stack_fffffffffffffe78._M_current >> 0x20)
                                   ,(ScriptError *)
                                    CONCAT17(in_stack_fffffffffffffe77,
                                             CONCAT16(in_stack_fffffffffffffe76,
                                                      CONCAT15(in_stack_fffffffffffffe75,
                                                               CONCAT14(in_stack_fffffffffffffe74,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           CONCAT11(in_stack_fffffffffffffe71,
                                                                    in_stack_fffffffffffffe70)))))))
                                  );
                if ((bool)uVar6) {
                  bVar2 = std::
                          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)in_stack_fffffffffffffe68);
                  if (bVar2) {
                    local_c2 = anon_unknown.dwarf_4a160d::set_error
                                         ((ScriptError *)
                                          CONCAT44(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58),SCRIPT_ERR_OK);
                    iVar9 = 1;
                  }
                  else {
                    std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
                    bVar2 = CastToBool((valtype *)
                                       CONCAT17(in_stack_fffffffffffffe77,
                                                CONCAT16(in_stack_fffffffffffffe76,
                                                         CONCAT15(in_stack_fffffffffffffe75,
                                                                  CONCAT14(in_stack_fffffffffffffe74
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           CONCAT11(in_stack_fffffffffffffe71,
                                                                    in_stack_fffffffffffffe70)))))))
                                      );
                    if (bVar2) {
                      if (((in_ECX & 0x800) == 0) ||
                         (uVar3 = CScript::IsWitnessProgram
                                            ((CScript *)
                                             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffeb6,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffeb5,
                                                  CONCAT14(in_stack_fffffffffffffeb4,
                                                           in_stack_fffffffffffffeb0)))),
                                             (int *)CONCAT17(in_stack_fffffffffffffeaf,
                                                             CONCAT16(in_stack_fffffffffffffeae,
                                                                      CONCAT15(uVar4,CONCAT14(uVar5,
                                                  CONCAT13(in_stack_fffffffffffffeab,
                                                           CONCAT12(uVar6,CONCAT11(
                                                  in_stack_fffffffffffffea9,
                                                  in_stack_fffffffffffffea8))))))),
                                             (vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)CONCAT17(in_stack_fffffffffffffea7,
                                                         in_stack_fffffffffffffea0)), !(bool)uVar3))
                      {
LAB_003ed5df:
                        iVar9 = 0;
                      }
                      else {
                        bVar8 = true;
                        CScript::CScript((CScript *)
                                         CONCAT44(in_stack_fffffffffffffe5c,
                                                  in_stack_fffffffffffffe58));
                        _Var10._M_extent_value =
                             (size_t)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                               (in_stack_fffffffffffffe60);
                        this = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                                         (in_stack_fffffffffffffe60);
                        __a = local_c1;
                        std::allocator<unsigned_char>::allocator
                                  ((allocator<unsigned_char> *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
                        __first.ptr._1_1_ = in_stack_fffffffffffffea9;
                        __first.ptr._0_1_ = in_stack_fffffffffffffea8;
                        __first.ptr._2_1_ = uVar6;
                        __first.ptr._3_1_ = in_stack_fffffffffffffeab;
                        __first.ptr._4_1_ = uVar5;
                        __first.ptr._5_1_ = uVar4;
                        __first.ptr._6_1_ = in_stack_fffffffffffffeae;
                        __first.ptr._7_1_ = in_stack_fffffffffffffeaf;
                        __last.ptr._7_1_ = uVar3;
                        __last.ptr._0_7_ = in_stack_fffffffffffffea0;
                        std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this.ptr
                                   ,__first,__last,__a);
                        std::span<const_unsigned_char,_18446744073709551615UL>::
                        span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  ((span<const_unsigned_char,_18446744073709551615UL> *)
                                   in_stack_fffffffffffffe68,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffe60);
                        b._M_extent._M_extent_value = _Var10._M_extent_value;
                        b._M_ptr = in_RDI;
                        this_00 = CScript::operator<<((CScript *)
                                                      in_stack_fffffffffffffe78._M_current,b);
                        bVar7 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                                          (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffe68);
                        std::allocator<unsigned_char>::~allocator
                                  ((allocator<unsigned_char> *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
                        CScript::~CScript((CScript *)
                                          CONCAT44(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58));
                        if ((bVar7 & 1) == 0) {
                          in_stack_fffffffffffffe58 = 1;
                          bVar2 = VerifyWitnessProgram
                                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                             (bool)in_stack_ffffffffffffff87);
                          if (bVar2) {
                            std::
                            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)this_00,
                                     CONCAT17(bVar7,CONCAT16(in_stack_fffffffffffffe76,
                                                             CONCAT15(bVar2,CONCAT14(
                                                  in_stack_fffffffffffffe74,
                                                  CONCAT13(in_stack_fffffffffffffe73,
                                                           CONCAT12(in_stack_fffffffffffffe72,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe71,
                                                  in_stack_fffffffffffffe70))))))));
                            goto LAB_003ed5df;
                          }
                          local_c2 = 0;
                          iVar9 = 1;
                        }
                        else {
                          local_c2 = anon_unknown.dwarf_4a160d::set_error
                                               ((ScriptError *)
                                                CONCAT44(in_stack_fffffffffffffe5c,
                                                         in_stack_fffffffffffffe58),SCRIPT_ERR_OK);
                          iVar9 = 1;
                        }
                      }
                    }
                    else {
                      local_c2 = anon_unknown.dwarf_4a160d::set_error
                                           ((ScriptError *)
                                            CONCAT44(in_stack_fffffffffffffe5c,
                                                     in_stack_fffffffffffffe58),SCRIPT_ERR_OK);
                      iVar9 = 1;
                    }
                  }
                }
                else {
                  local_c2 = 0;
                  iVar9 = 1;
                }
                CScript::~CScript((CScript *)
                                  CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
                if (iVar9 == 0) goto LAB_003ed61c;
              }
              else {
                local_c2 = anon_unknown.dwarf_4a160d::set_error
                                     ((ScriptError *)
                                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                      SCRIPT_ERR_OK);
              }
            }
          }
          else {
            bVar8 = true;
            in_stack_fffffffffffffeb0 =
                 prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffe68);
            if (in_stack_fffffffffffffeb0 == 0) {
              in_stack_fffffffffffffe58 = 0;
              in_stack_fffffffffffffeae =
                   VerifyWitnessProgram
                             (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                              in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                              in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              (bool)in_stack_ffffffffffffff87);
              if ((bool)in_stack_fffffffffffffeae) {
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)in_stack_fffffffffffffe78._M_current,
                         CONCAT17(in_stack_fffffffffffffe77,
                                  CONCAT16(in_stack_fffffffffffffe76,
                                           CONCAT15(in_stack_fffffffffffffe75,
                                                    CONCAT14(in_stack_fffffffffffffe74,
                                                             CONCAT13(in_stack_fffffffffffffe73,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  CONCAT11(in_stack_fffffffffffffe71,
                                                           in_stack_fffffffffffffe70))))))));
                goto LAB_003ed10a;
              }
              local_c2 = 0;
            }
            else {
              local_c2 = anon_unknown.dwarf_4a160d::set_error
                                   ((ScriptError *)
                                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                    SCRIPT_ERR_OK);
            }
          }
LAB_003ed7a8:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffe68);
        }
        else {
          local_c2 = anon_unknown.dwarf_4a160d::set_error
                               ((ScriptError *)
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                SCRIPT_ERR_OK);
        }
      }
    }
    else {
      local_c2 = 0;
    }
  }
  else {
    local_c2 = 0;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffe68);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffe68);
LAB_003ed7fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_c2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool VerifyScript(const CScript& scriptSig, const CScript& scriptPubKey, const CScriptWitness* witness, unsigned int flags, const BaseSignatureChecker& checker, ScriptError* serror)
{
    static const CScriptWitness emptyWitness;
    if (witness == nullptr) {
        witness = &emptyWitness;
    }
    bool hadWitness = false;

    set_error(serror, SCRIPT_ERR_UNKNOWN_ERROR);

    if ((flags & SCRIPT_VERIFY_SIGPUSHONLY) != 0 && !scriptSig.IsPushOnly()) {
        return set_error(serror, SCRIPT_ERR_SIG_PUSHONLY);
    }

    // scriptSig and scriptPubKey must be evaluated sequentially on the same stack
    // rather than being simply concatenated (see CVE-2010-5141)
    std::vector<std::vector<unsigned char> > stack, stackCopy;
    if (!EvalScript(stack, scriptSig, flags, checker, SigVersion::BASE, serror))
        // serror is set
        return false;
    if (flags & SCRIPT_VERIFY_P2SH)
        stackCopy = stack;
    if (!EvalScript(stack, scriptPubKey, flags, checker, SigVersion::BASE, serror))
        // serror is set
        return false;
    if (stack.empty())
        return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
    if (CastToBool(stack.back()) == false)
        return set_error(serror, SCRIPT_ERR_EVAL_FALSE);

    // Bare witness programs
    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (flags & SCRIPT_VERIFY_WITNESS) {
        if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
            hadWitness = true;
            if (scriptSig.size() != 0) {
                // The scriptSig must be _exactly_ CScript(), otherwise we reintroduce malleability.
                return set_error(serror, SCRIPT_ERR_WITNESS_MALLEATED);
            }
            if (!VerifyWitnessProgram(*witness, witnessversion, witnessprogram, flags, checker, serror, /*is_p2sh=*/false)) {
                return false;
            }
            // Bypass the cleanstack check at the end. The actual stack is obviously not clean
            // for witness programs.
            stack.resize(1);
        }
    }

    // Additional validation for spend-to-script-hash transactions:
    if ((flags & SCRIPT_VERIFY_P2SH) && scriptPubKey.IsPayToScriptHash())
    {
        // scriptSig must be literals-only or validation fails
        if (!scriptSig.IsPushOnly())
            return set_error(serror, SCRIPT_ERR_SIG_PUSHONLY);

        // Restore stack.
        swap(stack, stackCopy);

        // stack cannot be empty here, because if it was the
        // P2SH  HASH <> EQUAL  scriptPubKey would be evaluated with
        // an empty stack and the EvalScript above would return false.
        assert(!stack.empty());

        const valtype& pubKeySerialized = stack.back();
        CScript pubKey2(pubKeySerialized.begin(), pubKeySerialized.end());
        popstack(stack);

        if (!EvalScript(stack, pubKey2, flags, checker, SigVersion::BASE, serror))
            // serror is set
            return false;
        if (stack.empty())
            return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
        if (!CastToBool(stack.back()))
            return set_error(serror, SCRIPT_ERR_EVAL_FALSE);

        // P2SH witness program
        if (flags & SCRIPT_VERIFY_WITNESS) {
            if (pubKey2.IsWitnessProgram(witnessversion, witnessprogram)) {
                hadWitness = true;
                if (scriptSig != CScript() << std::vector<unsigned char>(pubKey2.begin(), pubKey2.end())) {
                    // The scriptSig must be _exactly_ a single push of the redeemScript. Otherwise we
                    // reintroduce malleability.
                    return set_error(serror, SCRIPT_ERR_WITNESS_MALLEATED_P2SH);
                }
                if (!VerifyWitnessProgram(*witness, witnessversion, witnessprogram, flags, checker, serror, /*is_p2sh=*/true)) {
                    return false;
                }
                // Bypass the cleanstack check at the end. The actual stack is obviously not clean
                // for witness programs.
                stack.resize(1);
            }
        }
    }

    // The CLEANSTACK check is only performed after potential P2SH evaluation,
    // as the non-P2SH evaluation of a P2SH script will obviously not result in
    // a clean stack (the P2SH inputs remain). The same holds for witness evaluation.
    if ((flags & SCRIPT_VERIFY_CLEANSTACK) != 0) {
        // Disallow CLEANSTACK without P2SH, as otherwise a switch CLEANSTACK->P2SH+CLEANSTACK
        // would be possible, which is not a softfork (and P2SH should be one).
        assert((flags & SCRIPT_VERIFY_P2SH) != 0);
        assert((flags & SCRIPT_VERIFY_WITNESS) != 0);
        if (stack.size() != 1) {
            return set_error(serror, SCRIPT_ERR_CLEANSTACK);
        }
    }

    if (flags & SCRIPT_VERIFY_WITNESS) {
        // We can't check for correct unexpected witness data if P2SH was off, so require
        // that WITNESS implies P2SH. Otherwise, going from WITNESS->P2SH+WITNESS would be
        // possible, which is not a softfork.
        assert((flags & SCRIPT_VERIFY_P2SH) != 0);
        if (!hadWitness && !witness->IsNull()) {
            return set_error(serror, SCRIPT_ERR_WITNESS_UNEXPECTED);
        }
    }

    return set_success(serror);
}